

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cpp
# Opt level: O2

void process_header(HttpRequest *req,HttpResponse *res)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  HttpResponse *pHVar5;
  long lVar6;
  ulong uVar7;
  int local_12c;
  sregex_iterator iter;
  sregex_iterator end;
  regex e;
  vector<int,_std::allocator<int>_> tokens;
  string_type local_70;
  string range;
  
  p_Var4 = (req->_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(req->_headers)._M_t._M_impl.super__Rb_tree_header) {
      uVar3 = accessable(res->filename);
      printf("access:%d",(ulong)uVar3);
      iVar2 = accessable(res->filename);
      pHVar5 = res;
      if (iVar2 == 0) {
        return;
      }
LAB_001079a4:
      HttpResponse::setStCode(pHVar5,0x12e);
      std::__cxx11::string::string((string *)&iter,"Location",(allocator *)&e);
      std::__cxx11::string::string((string *)&end,"/302.html",(allocator *)&local_70);
      HttpResponse::addHeader(res,(string *)&iter,(string *)&end);
LAB_001079f6:
      std::
      _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&end._M_match);
      std::
      _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&iter._M_match);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&e);
      HttpResponse::setStCode(res,0xce);
      res->is_range = true;
      res->start_pos =
           *tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
      res->end_pos = tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[1];
      std::__cxx11::string::string((string *)&iter,"Content-Length",(allocator *)&e);
      std::__cxx11::to_string((string *)&end,res->end_pos - res->start_pos);
      pHVar5 = HttpResponse::addHeader(res,(string *)&iter,(string *)&end);
      std::__cxx11::string::~string((string *)&end);
      std::__cxx11::string::~string((string *)&iter);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&tokens.super__Vector_base<int,_std::allocator<int>_>);
      std::__cxx11::string::~string((string *)&range);
      _Unwind_Resume(pHVar5);
    }
    pHVar5 = (HttpResponse *)(p_Var4 + 1);
    iVar2 = std::__cxx11::string::compare((char *)pHVar5);
    if (iVar2 == 0) {
LAB_00107826:
      std::__cxx11::string::string((string *)&range,(string *)(p_Var4 + 2));
      range._M_dataplus._M_p[5] = ' ';
      std::__cxx11::string::append((char *)&range);
      tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&e,"\\d+",0x10);
      std::__cxx11::
      regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
      ::regex_iterator(&iter,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )range._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(range._M_dataplus._M_p + range._M_string_length),&e,0);
      end._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      end._M_match._M_begin._M_current = (char *)0x0;
      end._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      end._M_match.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      end._M_begin._M_current = (char *)0x0;
      end._M_end._M_current._0_4_ = 0;
      end._M_end._M_current._4_4_ = 0;
      end._M_pregex._0_4_ = 0;
      end._20_8_ = 0;
      while( true ) {
        bVar1 = std::__cxx11::
                regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                ::operator!=(&iter,&end);
        if (!bVar1) break;
        lVar6 = 0;
        uVar7 = 0;
        while( true ) {
          if ((iter._M_match.
               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               iter._M_match.
               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (((long)iter._M_match.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)iter._M_match.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 3U <= uVar7)) break;
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_70,
                (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&((iter._M_match.
                             super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).first._M_current + lVar6));
          local_12c = std::__cxx11::stoi(&local_70,(size_t *)0x0,10);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&tokens,&local_12c);
          std::__cxx11::string::~string((string *)&local_70);
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + 0x18;
        }
        std::__cxx11::
        regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
        ::operator++(&iter);
      }
      goto LAB_001079f6;
    }
    iVar2 = std::__cxx11::string::compare((char *)pHVar5);
    if (iVar2 == 0) {
      iVar2 = std::__cxx11::string::compare((char *)(p_Var4 + 2));
      if (iVar2 == 0) {
        std::__cxx11::string::string((string *)&iter,"Connection",(allocator *)&e);
        std::__cxx11::string::string((string *)&end,"Keep-Alive",(allocator *)&local_70);
        HttpResponse::addHeader(res,(string *)&iter,(string *)&end);
        goto LAB_001079a4;
      }
    }
    if (res->isChunked == true) {
      std::__cxx11::string::string((string *)&iter,"Transfer-Encoding",(allocator *)&e);
      std::__cxx11::string::string((string *)&end,"chunked",(allocator *)&local_70);
      HttpResponse::addHeader(res,(string *)&iter,(string *)&end);
      goto LAB_00107826;
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void process_header(HttpRequest &req, HttpResponse &res)
{
    map<string, string>::iterator iter;
    for (iter = req._headers.begin(); iter != req._headers.end(); ++iter) {
        if (iter->first.compare("Range") == 0) {
            // Range: bytes=0-1023
            string range = iter->second;
            range[5] = ' ';
            range.append("/");
            vector<int> tokens;
            getNumberByReg(range, tokens);
            res.setStCode(206);
            res.is_range = true;
            res.start_pos = tokens[0];
            res.end_pos = tokens[1];
            res.addHeader(CONTENT_LENGTH,
                          std::to_string(res.end_pos - res.start_pos));
            tokens.clear();
            res.addHeader("Accept-Ranges", "bytes");
            res.addHeader(
                CONTENT_RANGE,
                range.append(std::to_string(get_file_size(res.filename))));
        }
        if (iter->first.compare("Connection") == 0 &&
            iter->second.compare("Keep-Alive") == 0) {
            res.addHeader("Connection", "Keep-Alive");
            req.setKeepAlive(true);
        }
        if (res.IsChunked()) {
            res.addHeader("Transfer-Encoding", "chunked");
        }
    }
    printf("access:%d", accessable(res.filename));
    if (accessable(res.filename) != 0) {
        res.setStCode(302);
        res.addHeader("Location", "/302.html");
    }
}